

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BoolParameter::SerializeWithCachedSizes
          (BoolParameter *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BoolParameter *this_local;
  
  bVar1 = defaultvalue(this);
  if (bVar1) {
    bVar1 = defaultvalue(this);
    google::protobuf::internal::WireFormatLite::WriteBool(1,bVar1,output);
  }
  return;
}

Assistant:

void BoolParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BoolParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // bool defaultValue = 1;
  if (this->defaultvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(1, this->defaultvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BoolParameter)
}